

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_bdecode.cpp
# Opt level: O2

string * __thiscall
libtorrent::lazy_entry::dict_find_string_value_abi_cxx11_
          (string *__return_storage_ptr__,lazy_entry *this,char *name)

{
  lazy_entry *this_00;
  
  this_00 = dict_find(this,name);
  if ((this_00 == (lazy_entry *)0x0) || ((*(uint *)&this_00->field_0x14 & 0xe0000000) != 0x60000000)
     ) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    string_value_abi_cxx11_(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string lazy_entry::dict_find_string_value(char const* name) const
	{
		lazy_entry const* e = dict_find(name);
		if (e == nullptr || e->type() != lazy_entry::string_t) return std::string();
		return e->string_value();
	}